

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O1

intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
 __thiscall
tchecker::
pool_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,tchecker::zg::path::symbolic::edge_t>,unsigned_long,1ul>>
::
construct<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>const&>
          (pool_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,tchecker::zg::path::symbolic::edge_t>,unsigned_long,1ul>>
           *this,intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                 *args)

{
  undefined8 *puVar1;
  state_sptr_t *in_RDX;
  refcount_t *refcount;
  
  puVar1 = (undefined8 *)
           pool_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
           ::allocate((pool_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
                       *)args);
  if (puVar1 == (undefined8 *)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    graph::node_flags_t::node_flags_t((node_flags_t *)(puVar1 + 1),false,false);
    graph::node_zg_state_t::node_zg_state_t((node_zg_state_t *)(puVar1 + 2),in_RDX);
    puVar1[3] = 0;
    puVar1[4] = 0;
    *puVar1 = 0;
    *(undefined8 *)this = 0;
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
    ::reset((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
             *)this,(make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>
                     *)(puVar1 + 1));
  }
  return (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
          )(make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>
            *)this;
}

Assistant:

tchecker::intrusive_shared_ptr_t<T> construct(ARGS &&... args)
  {
    void * t = allocate();
    if (t == nullptr)
      return tchecker::intrusive_shared_ptr_t<T>(nullptr);
    // p points after the reference counter
    void * p = static_cast<typename T::refcount_t *>(t) + 1;
    try {
      T::construct(p, std::forward<ARGS>(args)...); // construct T in p with args
    }
    catch (...) {
      this->release(t);
      throw;
    }
    return tchecker::intrusive_shared_ptr_t<T>(reinterpret_cast<T *>(p));
  }